

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O0

bool WScriptJsrt::Initialize(void)

{
  char *content;
  bool bVar1;
  JsErrorCode JVar2;
  size_t sVar3;
  PAL_FILE *pPVar4;
  LPCWSTR pWVar5;
  DWORD_PTR sourceContext;
  JsErrorCode jsErrorCode_2;
  JsErrorCode jsErrorCode_1;
  JsValueRef fname;
  JsValueRef pvStack_bb0;
  JsErrorCode jsErrorCode;
  JsValueRef Test262ScriptRef;
  char Test262 [711];
  JsPropertyIdRef consoleName;
  JsValueRef console;
  JsValueRef global;
  JsPropertyIdRef wscriptName;
  JsPropertyIdRef argsName;
  JsValueRef argsObject;
  JsValueRef icuVersionNum;
  JsPropertyIdRef icuVersionProp;
  JsValueRef intlLibraryStr;
  JsPropertyIdRef intlLibraryProp;
  JsValueRef osValue;
  JsPropertyIdRef osProperty;
  JsPropertyIdRef binaryPathProperty;
  JsValueRef binaryPathValue;
  JsValueRef linkValue;
  JsPropertyIdRef linkProperty;
  JsValueRef buildValue;
  JsPropertyIdRef buildProperty;
  JsValueRef archValue;
  JsPropertyIdRef archProperty;
  JsPropertyIdRef platformProperty;
  JsValueRef platformObject;
  JsValueRef wscript;
  char *pcStack_820;
  int icuVersion;
  char *LINK_TYPE;
  char CH_BINARY_LOCATION [2048];
  int local_10;
  HRESULT hr;
  
  local_10 = 0;
  pcStack_820 = "shared";
  wscript._4_4_ = PlatformAgnostic::ICUHelpers::GetICUMajorVersion();
  JVar2 = ChakraRTInterface::JsCreateObject(&platformObject);
  if (JVar2 != JsNoError) {
    return false;
  }
  bVar1 = InstallObjectsOnObject(platformObject,"monotonicNow",MonotonicNowCallback);
  if (bVar1) {
    bVar1 = InstallObjectsOnObject(platformObject,"Echo",EchoCallback);
    if (bVar1) {
      bVar1 = InstallObjectsOnObject(platformObject,"Quit",QuitCallback);
      if (bVar1) {
        bVar1 = InstallObjectsOnObject(platformObject,"LoadScriptFile",LoadScriptFileCallback);
        if (bVar1) {
          bVar1 = InstallObjectsOnObject(platformObject,"LoadScript",LoadScriptCallback);
          if (bVar1) {
            bVar1 = InstallObjectsOnObject(platformObject,"LoadModule",LoadModuleCallback);
            if (bVar1) {
              bVar1 = InstallObjectsOnObject(platformObject,"SetTimeout",SetTimeoutCallback);
              if (bVar1) {
                bVar1 = InstallObjectsOnObject(platformObject,"ClearTimeout",ClearTimeoutCallback);
                if (bVar1) {
                  bVar1 = InstallObjectsOnObject(platformObject,"Attach",AttachCallback);
                  if (bVar1) {
                    bVar1 = InstallObjectsOnObject(platformObject,"Detach",DetachCallback);
                    if (bVar1) {
                      bVar1 = InstallObjectsOnObject
                                        (platformObject,"DumpFunctionPosition",
                                         DumpFunctionPositionCallback);
                      if (bVar1) {
                        bVar1 = InstallObjectsOnObject
                                          (platformObject,"RequestAsyncBreak",
                                           RequestAsyncBreakCallback);
                        if (bVar1) {
                          bVar1 = InstallObjectsOnObject
                                            (platformObject,"LoadBinaryFile",LoadBinaryFileCallback)
                          ;
                          if (bVar1) {
                            bVar1 = InstallObjectsOnObject
                                              (platformObject,"LoadTextFile",LoadTextFileCallback);
                            if (bVar1) {
                              bVar1 = InstallObjectsOnObject(platformObject,"Flag",FlagCallback);
                              if (bVar1) {
                                bVar1 = InstallObjectsOnObject
                                                  (platformObject,"RegisterModuleSource",
                                                   RegisterModuleSourceCallback);
                                if (bVar1) {
                                  bVar1 = InstallObjectsOnObject
                                                    (platformObject,"GetModuleNamespace",
                                                     GetModuleNamespace);
                                  if (bVar1) {
                                    bVar1 = InstallObjectsOnObject
                                                      (platformObject,"GetProxyProperties",
                                                       GetProxyPropertiesCallback);
                                    if (bVar1) {
                                      bVar1 = InstallObjectsOnObject
                                                        (platformObject,"SerializeObject",
                                                         SerializeObject);
                                      if (bVar1) {
                                        bVar1 = InstallObjectsOnObject
                                                          (platformObject,"Deserialize",Deserialize)
                                        ;
                                        if (bVar1) {
                                          JVar2 = ChakraRTInterface::JsCreateObject
                                                            (&platformProperty);
                                          if (JVar2 != JsNoError) {
                                            return false;
                                          }
                                          JVar2 = CreatePropertyIdFromString
                                                            ("Platform",&archProperty);
                                          if (JVar2 != JsNoError) {
                                            return false;
                                          }
                                          JVar2 = CreatePropertyIdFromString("ARCH",&archValue);
                                          if (JVar2 != JsNoError) {
                                            return false;
                                          }
                                          JVar2 = ChakraRTInterface::JsCreateString
                                                            ("x86_64",6,&buildProperty);
                                          if (JVar2 != JsNoError) {
                                            return false;
                                          }
                                          JVar2 = ChakraRTInterface::JsSetProperty
                                                            (platformProperty,archValue,
                                                             buildProperty,true);
                                          if (JVar2 != JsNoError) {
                                            return false;
                                          }
                                          JVar2 = CreatePropertyIdFromString
                                                            ("BUILD_TYPE",&buildValue);
                                          if (JVar2 != JsNoError) {
                                            return false;
                                          }
                                          JVar2 = ChakraRTInterface::JsCreateString
                                                            ("Debug",5,&linkProperty);
                                          if (JVar2 != JsNoError) {
                                            return false;
                                          }
                                          JVar2 = ChakraRTInterface::JsSetProperty
                                                            (platformProperty,buildValue,
                                                             linkProperty,true);
                                          if (JVar2 != JsNoError) {
                                            return false;
                                          }
                                          JVar2 = CreatePropertyIdFromString("LINK_TYPE",&linkValue)
                                          ;
                                          content = pcStack_820;
                                          if (JVar2 != JsNoError) {
                                            return false;
                                          }
                                          sVar3 = strlen(pcStack_820);
                                          JVar2 = ChakraRTInterface::JsCreateString
                                                            (content,sVar3,&binaryPathValue);
                                          if (JVar2 != JsNoError) {
                                            return false;
                                          }
                                          JVar2 = ChakraRTInterface::JsSetProperty
                                                            (platformProperty,linkValue,
                                                             binaryPathValue,true);
                                          if (JVar2 != JsNoError) {
                                            return false;
                                          }
                                          PlatformAgnostic::SystemInfo::GetBinaryLocation
                                                    ((char *)&LINK_TYPE,0x800);
                                          JVar2 = CreatePropertyIdFromString
                                                            ("BINARY_PATH",&osProperty);
                                          if (JVar2 != JsNoError) {
                                            return false;
                                          }
                                          sVar3 = strlen((char *)&LINK_TYPE);
                                          JVar2 = ChakraRTInterface::JsCreateString
                                                            ((char *)&LINK_TYPE,sVar3,
                                                             &binaryPathProperty);
                                          if (JVar2 != JsNoError) {
                                            return false;
                                          }
                                          JVar2 = ChakraRTInterface::JsSetProperty
                                                            (platformProperty,osProperty,
                                                             binaryPathProperty,true);
                                          if (JVar2 != JsNoError) {
                                            return false;
                                          }
                                          JVar2 = CreatePropertyIdFromString("OS",&osValue);
                                          if (JVar2 != JsNoError) {
                                            return false;
                                          }
                                          JVar2 = ChakraRTInterface::JsCreateString
                                                            ("posix",5,&intlLibraryProp);
                                          if (JVar2 != JsNoError) {
                                            return false;
                                          }
                                          JVar2 = ChakraRTInterface::JsSetProperty
                                                            (platformProperty,osValue,
                                                             intlLibraryProp,true);
                                          if (JVar2 != JsNoError) {
                                            return false;
                                          }
                                          JVar2 = CreatePropertyIdFromString
                                                            ("INTL_LIBRARY",&intlLibraryStr);
                                          if (JVar2 != JsNoError) {
                                            return false;
                                          }
                                          JVar2 = ChakraRTInterface::JsCreateString
                                                            ("icu",3,&icuVersionProp);
                                          if (JVar2 != JsNoError) {
                                            return false;
                                          }
                                          JVar2 = ChakraRTInterface::JsSetProperty
                                                            (platformProperty,intlLibraryStr,
                                                             icuVersionProp,true);
                                          if (JVar2 != JsNoError) {
                                            return false;
                                          }
                                          JVar2 = CreatePropertyIdFromString
                                                            ("ICU_VERSION",&icuVersionNum);
                                          if (JVar2 != JsNoError) {
                                            return false;
                                          }
                                          JVar2 = ChakraRTInterface::JsIntToNumber
                                                            (wscript._4_4_,&argsObject);
                                          if (JVar2 != JsNoError) {
                                            return false;
                                          }
                                          JVar2 = ChakraRTInterface::JsSetProperty
                                                            (platformProperty,icuVersionNum,
                                                             argsObject,true);
                                          if (JVar2 != JsNoError) {
                                            return false;
                                          }
                                          JVar2 = ChakraRTInterface::JsSetProperty
                                                            (platformObject,archProperty,
                                                             platformProperty,true);
                                          if (JVar2 != JsNoError) {
                                            return false;
                                          }
                                          bVar1 = CreateArgumentsObject(&argsName);
                                          if (!bVar1) {
                                            return false;
                                          }
                                          JVar2 = CreatePropertyIdFromString
                                                            ("Arguments",&wscriptName);
                                          if (JVar2 != JsNoError) {
                                            return false;
                                          }
                                          JVar2 = ChakraRTInterface::JsSetProperty
                                                            (platformObject,wscriptName,argsName,
                                                             true);
                                          if (JVar2 != JsNoError) {
                                            return false;
                                          }
                                          JVar2 = CreatePropertyIdFromString("WScript",&global);
                                          if (JVar2 != JsNoError) {
                                            return false;
                                          }
                                          JVar2 = ChakraRTInterface::JsGetGlobalObject(&console);
                                          if (JVar2 != JsNoError) {
                                            return false;
                                          }
                                          JVar2 = ChakraRTInterface::JsSetProperty
                                                            (console,global,platformObject,true);
                                          if (JVar2 != JsNoError) {
                                            return false;
                                          }
                                          bVar1 = InstallObjectsOnObject
                                                            (console,"print",EchoCallback);
                                          if (bVar1) {
                                            bVar1 = InstallObjectsOnObject
                                                              (console,"read",LoadTextFileCallback);
                                            if (bVar1) {
                                              bVar1 = InstallObjectsOnObject
                                                                (console,"readbuffer",
                                                                 LoadBinaryFileCallback);
                                              if (bVar1) {
                                                bVar1 = InstallObjectsOnObject
                                                                  (console,"readline",
                                                                   ReadLineStdinCallback);
                                                if (bVar1) {
                                                  JVar2 = ChakraRTInterface::JsCreateObject
                                                                    (&consoleName);
                                                  if (JVar2 != JsNoError) {
                                                    return false;
                                                  }
                                                  bVar1 = InstallObjectsOnObject
                                                                    (consoleName,"log",EchoCallback)
                                                  ;
                                                  if (bVar1) {
                                                    JVar2 = CreatePropertyIdFromString
                                                                      ("console",
                                                                       (JsPropertyIdRef *)
                                                                       (Test262 + 0x2c0));
                                                    if (JVar2 != JsNoError) {
                                                      return false;
                                                    }
                                                    JVar2 = ChakraRTInterface::JsSetProperty
                                                                      (console,
                                                  stack0xfffffffffffff720,consoleName,true);
                                                  if (JVar2 != JsNoError) {
                                                    return false;
                                                  }
                                                  JVar2 = ChakraRTInterface::JsSetModuleHostInfo
                                                                    ((JsModuleRecord)0x0,
                                                                                                                                          
                                                  JsModuleHostInfo_FetchImportedModuleCallback,
                                                  FetchImportedModule);
                                                  if (JVar2 != JsNoError) {
                                                    return false;
                                                  }
                                                  JVar2 = ChakraRTInterface::JsSetModuleHostInfo
                                                                    ((JsModuleRecord)0x0,
                                                                                                                                          
                                                  JsModuleHostInfo_FetchImportedModuleFromScriptCallback
                                                  ,FetchImportedModuleFromScript);
                                                  if (JVar2 != JsNoError) {
                                                    return false;
                                                  }
                                                  JVar2 = ChakraRTInterface::JsSetModuleHostInfo
                                                                    ((JsModuleRecord)0x0,
                                                                                                                                          
                                                  JsModuleHostInfo_NotifyModuleReadyCallback,
                                                  NotifyModuleReadyCallback);
                                                  if (JVar2 != JsNoError) {
                                                    return false;
                                                  }
                                                  JVar2 = ChakraRTInterface::JsSetModuleHostInfo
                                                                    ((JsModuleRecord)0x0,
                                                                                                                                          
                                                  JsModuleHostInfo_InitializeImportMetaCallback,
                                                  InitializeImportMetaCallback);
                                                  if (JVar2 != JsNoError) {
                                                    return false;
                                                  }
                                                  JVar2 = ChakraRTInterface::JsSetModuleHostInfo
                                                                    ((JsModuleRecord)0x0,
                                                                                                                                          
                                                  JsModuleHostInfo_ReportModuleCompletionCallback,
                                                  ReportModuleCompletionCallback);
                                                  if (JVar2 != JsNoError) {
                                                    return false;
                                                  }
                                                  if ((HostConfigFlags::flags.Test262 & 1U) != 0) {
                                                    bVar1 = InstallObjectsOnObject
                                                                      (platformObject,"Broadcast",
                                                                       BroadcastCallback);
                                                    if (bVar1) {
                                                      bVar1 = InstallObjectsOnObject
                                                                        (platformObject,
                                                                         "ReceiveBroadcast",
                                                                         ReceiveBroadcastCallback);
                                                      if (bVar1) {
                                                        bVar1 = InstallObjectsOnObject
                                                                          (platformObject,"Report",
                                                                           ReportCallback);
                                                        if (bVar1) {
                                                          bVar1 = InstallObjectsOnObject
                                                                            (platformObject,
                                                                             "GetReport",
                                                                             GetReportCallback);
                                                          if (bVar1) {
                                                            bVar1 = InstallObjectsOnObject
                                                                              (platformObject,
                                                                               "Leaving",
                                                                               LeavingCallback);
                                                            if (bVar1) {
                                                              bVar1 = InstallObjectsOnObject
                                                                                (platformObject,
                                                                                 "Sleep",
                                                  SleepCallback);
                                                  if (bVar1) {
                                                    memcpy(&Test262ScriptRef,
                                                                                                                      
                                                  "\nvar $262 = {\n    createRealm: () => WScript.LoadScript(\'\', \'samethread\').$262,\n    global: this,\n    agent: {\n        start(src) {\n            WScript.LoadScript(`\n                $262 = {\n                    agent: {\n                        receiveBroadcast: WScript.ReceiveBroadcast,\n                        report: WScript.Report,\n                        leaving: WScript.Leaving,\n                        monotonicNow: WScript.monotonicNow\n                    }\n                };\n                ${ src }\n            `, \'crossthread\');\n        },\n        broadcast: WScript.Broadcast,\n        sleep: WScript.Sleep,\n        getReport: WScript.GetReport,\n        monotonicNow: WScript.monotonicNow\n    }\n};\n"
                                                  ,0x2c7);
                                                  fname._4_4_ = ChakraRTInterface::JsCreateString
                                                                          ((char *)&Test262ScriptRef
                                                                           ,0x2c6,&
                                                  stack0xfffffffffffff450);
                                                  if (fname._4_4_ != JsNoError) {
                                                    pPVar4 = PAL_get_stderr(0);
                                                    JVar2 = fname._4_4_;
                                                    pWVar5 = Helpers::JsErrorCodeToString
                                                                       (fname._4_4_);
                                                    PAL_fwprintf(pPVar4,
                                                  L"ERROR: ChakraRTInterface::JsCreateString(Test262, strlen(Test262), &Test262ScriptRef) failed. JsErrorCode=0x%x (%s)\n"
                                                  ,(ulong)JVar2,pWVar5);
                                                  pPVar4 = PAL_get_stderr(0);
                                                  PAL_fflush(pPVar4);
                                                  return false;
                                                  }
                                                  JVar2 = ChakraRTInterface::JsCreateString
                                                                    ("262",3,(JsValueRef *)
                                                                             &jsErrorCode_2);
                                                  if (JVar2 != JsNoError) {
                                                    pPVar4 = PAL_get_stderr(0);
                                                    pWVar5 = Helpers::JsErrorCodeToString(JVar2);
                                                    PAL_fwprintf(pPVar4,
                                                  L"ERROR: ChakraRTInterface::JsCreateString(\"262\", strlen(\"262\"), &fname) failed. JsErrorCode=0x%x (%s)\n"
                                                  ,(ulong)JVar2,pWVar5);
                                                  pPVar4 = PAL_get_stderr(0);
                                                  PAL_fflush(pPVar4);
                                                  return false;
                                                  }
                                                  sourceContext = GetNextSourceContext();
                                                  JVar2 = ChakraRTInterface::JsRun
                                                                    (pvStack_bb0,sourceContext,
                                                                     _jsErrorCode_2,
                                                                     JsParseScriptAttributeNone,
                                                                     (JsValueRef *)0x0);
                                                  if (JVar2 != JsNoError) {
                                                    pPVar4 = PAL_get_stderr(0);
                                                    pWVar5 = Helpers::JsErrorCodeToString(JVar2);
                                                    PAL_fwprintf(pPVar4,
                                                  L"ERROR: ChakraRTInterface::JsRun(Test262ScriptRef, WScriptJsrt::GetNextSourceContext(), fname, JsParseScriptAttributeNone, nullptr) failed. JsErrorCode=0x%x (%s)\n"
                                                  ,(ulong)JVar2,pWVar5);
                                                  pPVar4 = PAL_get_stderr(0);
                                                  PAL_fflush(pPVar4);
                                                  return false;
                                                  }
                                                  }
                                                  else {
                                                    local_10 = -0x7fffbffb;
                                                  }
                                                  }
                                                  else {
                                                    local_10 = -0x7fffbffb;
                                                  }
                                                  }
                                                  else {
                                                    local_10 = -0x7fffbffb;
                                                  }
                                                  }
                                                  else {
                                                    local_10 = -0x7fffbffb;
                                                  }
                                                  }
                                                  else {
                                                    local_10 = -0x7fffbffb;
                                                  }
                                                  }
                                                  else {
                                                    local_10 = -0x7fffbffb;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    local_10 = -0x7fffbffb;
                                                  }
                                                }
                                                else {
                                                  local_10 = -0x7fffbffb;
                                                }
                                              }
                                              else {
                                                local_10 = -0x7fffbffb;
                                              }
                                            }
                                            else {
                                              local_10 = -0x7fffbffb;
                                            }
                                          }
                                          else {
                                            local_10 = -0x7fffbffb;
                                          }
                                        }
                                        else {
                                          local_10 = -0x7fffbffb;
                                        }
                                      }
                                      else {
                                        local_10 = -0x7fffbffb;
                                      }
                                    }
                                    else {
                                      local_10 = -0x7fffbffb;
                                    }
                                  }
                                  else {
                                    local_10 = -0x7fffbffb;
                                  }
                                }
                                else {
                                  local_10 = -0x7fffbffb;
                                }
                              }
                              else {
                                local_10 = -0x7fffbffb;
                              }
                            }
                            else {
                              local_10 = -0x7fffbffb;
                            }
                          }
                          else {
                            local_10 = -0x7fffbffb;
                          }
                        }
                        else {
                          local_10 = -0x7fffbffb;
                        }
                      }
                      else {
                        local_10 = -0x7fffbffb;
                      }
                    }
                    else {
                      local_10 = -0x7fffbffb;
                    }
                  }
                  else {
                    local_10 = -0x7fffbffb;
                  }
                }
                else {
                  local_10 = -0x7fffbffb;
                }
              }
              else {
                local_10 = -0x7fffbffb;
              }
            }
            else {
              local_10 = -0x7fffbffb;
            }
          }
          else {
            local_10 = -0x7fffbffb;
          }
        }
        else {
          local_10 = -0x7fffbffb;
        }
      }
      else {
        local_10 = -0x7fffbffb;
      }
    }
    else {
      local_10 = -0x7fffbffb;
    }
  }
  else {
    local_10 = -0x7fffbffb;
  }
  return local_10 == 0;
}

Assistant:

bool WScriptJsrt::Initialize()
{
    HRESULT hr = S_OK;
    char CH_BINARY_LOCATION[2048];
#ifdef CHAKRA_STATIC_LIBRARY
    const char* LINK_TYPE = "static";
#else
    const char* LINK_TYPE = "shared";
#endif
#ifdef HAS_ICU
    int icuVersion = PlatformAgnostic::ICUHelpers::GetICUMajorVersion();
#else
    int icuVersion = -1;
#endif

    JsValueRef wscript;
    IfJsrtErrorFail(ChakraRTInterface::JsCreateObject(&wscript), false);

    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(wscript, "monotonicNow", MonotonicNowCallback));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(wscript, "Echo", EchoCallback));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(wscript, "Quit", QuitCallback));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(wscript, "LoadScriptFile", LoadScriptFileCallback));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(wscript, "LoadScript", LoadScriptCallback));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(wscript, "LoadModule", LoadModuleCallback));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(wscript, "SetTimeout", SetTimeoutCallback));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(wscript, "ClearTimeout", ClearTimeoutCallback));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(wscript, "Attach", AttachCallback));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(wscript, "Detach", DetachCallback));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(wscript, "DumpFunctionPosition", DumpFunctionPositionCallback));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(wscript, "RequestAsyncBreak", RequestAsyncBreakCallback));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(wscript, "LoadBinaryFile", LoadBinaryFileCallback));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(wscript, "LoadTextFile", LoadTextFileCallback));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(wscript, "Flag", FlagCallback));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(wscript, "RegisterModuleSource", RegisterModuleSourceCallback));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(wscript, "GetModuleNamespace", GetModuleNamespace));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(wscript, "GetProxyProperties", GetProxyPropertiesCallback));

    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(wscript, "SerializeObject", SerializeObject));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(wscript, "Deserialize", Deserialize));

    // Platform
    JsValueRef platformObject;
    IfJsrtErrorFail(ChakraRTInterface::JsCreateObject(&platformObject), false);
    JsPropertyIdRef platformProperty;
    IfJsrtErrorFail(CreatePropertyIdFromString("Platform", &platformProperty), false);

    // Set CPU arch
    JsPropertyIdRef archProperty;
    IfJsrtErrorFail(CreatePropertyIdFromString("ARCH", &archProperty), false);
    JsValueRef archValue;
    IfJsrtErrorFail(ChakraRTInterface::JsCreateString(
        CPU_ARCH_TEXT, strlen(CPU_ARCH_TEXT), &archValue), false);
    IfJsrtErrorFail(ChakraRTInterface::JsSetProperty(platformObject, archProperty,
        archValue, true), false);

    // Set Build Type
    JsPropertyIdRef buildProperty;
    IfJsrtErrorFail(CreatePropertyIdFromString("BUILD_TYPE", &buildProperty), false);
    JsValueRef buildValue;
#ifdef _DEBUG
#define BUILD_TYPE_STRING_CH "Debug" // (O0)
#elif defined(ENABLE_DEBUG_CONFIG_OPTIONS)
#define BUILD_TYPE_STRING_CH "Test" // (O3 with debug config options)
#else
#define BUILD_TYPE_STRING_CH "Release" // (O3)
#endif
    IfJsrtErrorFail(ChakraRTInterface::JsCreateString(
        BUILD_TYPE_STRING_CH, strlen(BUILD_TYPE_STRING_CH), &buildValue), false);
    IfJsrtErrorFail(ChakraRTInterface::JsSetProperty(platformObject, buildProperty,
        buildValue, true), false);
#undef BUILD_TYPE_STRING_CH

    // Set Link Type [static / shared]
    JsPropertyIdRef linkProperty;
    IfJsrtErrorFail(CreatePropertyIdFromString("LINK_TYPE", &linkProperty), false);
    JsValueRef linkValue;
    IfJsrtErrorFail(ChakraRTInterface::JsCreateString(
        LINK_TYPE, strlen(LINK_TYPE), &linkValue), false);
    IfJsrtErrorFail(ChakraRTInterface::JsSetProperty(platformObject, linkProperty,
      linkValue, true), false);

    // Set Binary Location
    JsValueRef binaryPathValue;
    PlatformAgnostic::SystemInfo::GetBinaryLocation(CH_BINARY_LOCATION, sizeof(CH_BINARY_LOCATION));

    JsPropertyIdRef binaryPathProperty;
    IfJsrtErrorFail(CreatePropertyIdFromString("BINARY_PATH", &binaryPathProperty), false);

    IfJsrtErrorFail(ChakraRTInterface::JsCreateString(
        CH_BINARY_LOCATION,
        strlen(CH_BINARY_LOCATION), &binaryPathValue), false);
    IfJsrtErrorFail(ChakraRTInterface::JsSetProperty(
        platformObject, binaryPathProperty, binaryPathValue, true), false);

    // Set destination OS
    JsPropertyIdRef osProperty;
    IfJsrtErrorFail(CreatePropertyIdFromString("OS", &osProperty), false);
    JsValueRef osValue;
    IfJsrtErrorFail(ChakraRTInterface::JsCreateString(
        DEST_PLATFORM_TEXT, strlen(DEST_PLATFORM_TEXT), &osValue), false);
    IfJsrtErrorFail(ChakraRTInterface::JsSetProperty(platformObject, osProperty,
        osValue, true), false);

    // set Internationalization library
    JsPropertyIdRef intlLibraryProp;
    IfJsrtErrorFail(CreatePropertyIdFromString("INTL_LIBRARY", &intlLibraryProp), false);
    JsValueRef intlLibraryStr;
    IfJsrtErrorFail(ChakraRTInterface::JsCreateString(INTL_LIBRARY_TEXT, strlen(INTL_LIBRARY_TEXT), &intlLibraryStr), false);
    IfJsrtErrorFail(ChakraRTInterface::JsSetProperty(platformObject, intlLibraryProp, intlLibraryStr, true), false);
    JsPropertyIdRef icuVersionProp;
    IfJsrtErrorFail(CreatePropertyIdFromString("ICU_VERSION", &icuVersionProp), false);
    JsValueRef icuVersionNum;
    IfJsrtErrorFail(ChakraRTInterface::JsIntToNumber(icuVersion, &icuVersionNum), false);
    IfJsrtErrorFail(ChakraRTInterface::JsSetProperty(platformObject, icuVersionProp, icuVersionNum, true), false);

    IfJsrtErrorFail(ChakraRTInterface::JsSetProperty(wscript, platformProperty,
        platformObject, true), false);

    JsValueRef argsObject;

    if (!CreateArgumentsObject(&argsObject))
    {
        return false;
    }

    JsPropertyIdRef argsName;
    IfJsrtErrorFail(CreatePropertyIdFromString("Arguments", &argsName), false);
    IfJsrtErrorFail(ChakraRTInterface::JsSetProperty(wscript, argsName, argsObject, true), false);

    JsPropertyIdRef wscriptName;
    IfJsrtErrorFail(CreatePropertyIdFromString("WScript", &wscriptName), false);

    JsValueRef global;
    IfJsrtErrorFail(ChakraRTInterface::JsGetGlobalObject(&global), false);
    IfJsrtErrorFail(ChakraRTInterface::JsSetProperty(global, wscriptName, wscript, true), false);

    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(global, "print", EchoCallback));

    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(global, "read", LoadTextFileCallback));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(global, "readbuffer", LoadBinaryFileCallback));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(global, "readline", ReadLineStdinCallback));

    JsValueRef console;
    IfJsrtErrorFail(ChakraRTInterface::JsCreateObject(&console), false);
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(console, "log", EchoCallback));

    JsPropertyIdRef consoleName;
    IfJsrtErrorFail(CreatePropertyIdFromString("console", &consoleName), false);
    IfJsrtErrorFail(ChakraRTInterface::JsSetProperty(global, consoleName, console, true), false);

    IfJsrtErrorFail(ChakraRTInterface::JsSetModuleHostInfo(nullptr, JsModuleHostInfo_FetchImportedModuleCallback, (void*)WScriptJsrt::FetchImportedModule), false);
    IfJsrtErrorFail(ChakraRTInterface::JsSetModuleHostInfo(nullptr, JsModuleHostInfo_FetchImportedModuleFromScriptCallback, (void*)WScriptJsrt::FetchImportedModuleFromScript), false);
    IfJsrtErrorFail(ChakraRTInterface::JsSetModuleHostInfo(nullptr, JsModuleHostInfo_NotifyModuleReadyCallback, (void*)WScriptJsrt::NotifyModuleReadyCallback), false);
    IfJsrtErrorFail(ChakraRTInterface::JsSetModuleHostInfo(nullptr, JsModuleHostInfo_InitializeImportMetaCallback, (void*)WScriptJsrt::InitializeImportMetaCallback), false);
    IfJsrtErrorFail(ChakraRTInterface::JsSetModuleHostInfo(nullptr, JsModuleHostInfo_ReportModuleCompletionCallback, (void*)WScriptJsrt::ReportModuleCompletionCallback), false);

    // When the command-line argument `-Test262` is set,
    // WScript will have the extra support API below and $262 will be
    // added to global scope
    if (HostConfigFlags::flags.Test262)
    {
        IfFalseGo(WScriptJsrt::InstallObjectsOnObject(wscript, "Broadcast", BroadcastCallback));
        IfFalseGo(WScriptJsrt::InstallObjectsOnObject(wscript, "ReceiveBroadcast", ReceiveBroadcastCallback));
        IfFalseGo(WScriptJsrt::InstallObjectsOnObject(wscript, "Report", ReportCallback));
        IfFalseGo(WScriptJsrt::InstallObjectsOnObject(wscript, "GetReport", GetReportCallback));
        IfFalseGo(WScriptJsrt::InstallObjectsOnObject(wscript, "Leaving", LeavingCallback));
        IfFalseGo(WScriptJsrt::InstallObjectsOnObject(wscript, "Sleep", SleepCallback));

        // $262
        const char Test262[] =
            #include "262.js"
        ;

        JsValueRef Test262ScriptRef;
        IfJsrtErrorFailLogAndRetFalse(ChakraRTInterface::JsCreateString(Test262, strlen(Test262), &Test262ScriptRef));

        JsValueRef fname;
        IfJsrtErrorFailLogAndRetFalse(ChakraRTInterface::JsCreateString("262", strlen("262"), &fname));
        IfJsrtErrorFailLogAndRetFalse(ChakraRTInterface::JsRun(Test262ScriptRef, WScriptJsrt::GetNextSourceContext(), fname, JsParseScriptAttributeNone, nullptr));
    }

Error:
    return hr == S_OK;
}